

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O0

void xmlCtxtDumpDocument(xmlDebugCtxtPtr ctxt,xmlDocPtr doc)

{
  xmlDocPtr doc_local;
  xmlDebugCtxtPtr ctxt_local;
  
  if (doc == (xmlDocPtr)0x0) {
    if (ctxt->check == 0) {
      fprintf((FILE *)ctxt->output,"DOCUMENT == NULL !\n");
    }
  }
  else {
    xmlCtxtDumpDocumentHead(ctxt,doc);
    if (((doc->type == XML_DOCUMENT_NODE) || (doc->type == XML_HTML_DOCUMENT_NODE)) &&
       (doc->children != (_xmlNode *)0x0)) {
      ctxt->depth = ctxt->depth + 1;
      xmlCtxtDumpNodeList(ctxt,doc->children);
      ctxt->depth = ctxt->depth + -1;
    }
  }
  return;
}

Assistant:

static void
xmlCtxtDumpDocument(xmlDebugCtxtPtr ctxt, xmlDocPtr doc)
{
    if (doc == NULL) {
        if (!ctxt->check)
            fprintf(ctxt->output, "DOCUMENT == NULL !\n");
        return;
    }
    xmlCtxtDumpDocumentHead(ctxt, doc);
    if (((doc->type == XML_DOCUMENT_NODE) ||
         (doc->type == XML_HTML_DOCUMENT_NODE))
        && (doc->children != NULL)) {
        ctxt->depth++;
        xmlCtxtDumpNodeList(ctxt, doc->children);
        ctxt->depth--;
    }
}